

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  size_t sVar1;
  int iVar2;
  uint32_t *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uchar *local_40;
  int local_34;
  
  sVar1 = ctx->rk_offset;
  puVar3 = ctx->buf + sVar1 + 0xb;
  uVar8 = ctx->buf[sVar1] ^ *(uint *)input;
  uVar10 = ctx->buf[sVar1 + 1] ^ *(uint *)(input + 4);
  uVar7 = ctx->buf[sVar1 + 2] ^ *(uint *)(input + 8);
  uVar9 = ctx->buf[sVar1 + 3] ^ *(uint *)(input + 0xc);
  iVar2 = ctx->nr >> 1;
  while (iVar4 = iVar2, 1 < iVar4) {
    uVar11 = FT0[uVar8 & 0xff] ^ puVar3[-7] ^ FT1[uVar10 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
    uVar6 = FT0[uVar10 & 0xff] ^ puVar3[-6] ^ FT1[uVar7 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar8 >> 0x18];
    uVar5 = FT0[uVar7 & 0xff] ^ puVar3[-5] ^ FT1[uVar9 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ FT3[uVar10 >> 0x18];
    uVar9 = FT0[uVar9 & 0xff] ^ ((mbedtls_aes_context *)(puVar3 + -4))->nr ^ FT1[uVar8 >> 8 & 0xff]
            ^ *(uint *)((long)FT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
    uVar8 = FT0[uVar11 & 0xff] ^ puVar3[-3] ^ FT1[uVar6 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
    uVar10 = FT0[uVar6 & 0xff] ^ (uint)*(size_t *)(puVar3 + -2) ^ FT1[uVar5 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar11 >> 0x18];
    uVar7 = FT0[uVar5 & 0xff] ^ puVar3[-1] ^ FT1[uVar9 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^ FT3[uVar6 >> 0x18];
    uVar9 = FT0[uVar9 & 0xff] ^ *puVar3 ^ FT1[uVar11 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ FT3[uVar5 >> 0x18];
    puVar3 = puVar3 + 8;
    local_34 = iVar4;
    iVar2 = iVar4 + -1;
  }
  local_50 = FT0[uVar8 & 0xff] ^ puVar3[-7] ^ FT1[uVar10 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
  local_4c = FT0[uVar10 & 0xff] ^ puVar3[-6] ^ FT1[uVar7 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar8 >> 0x18];
  local_48 = FT0[uVar7 & 0xff] ^ puVar3[-5] ^ FT1[uVar9 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ FT3[uVar10 >> 0x18];
  local_44 = FT0[uVar9 & 0xff] ^ ((mbedtls_aes_context *)(puVar3 + -4))->nr ^ FT1[uVar8 >> 8 & 0xff]
             ^ *(uint *)((long)FT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
  local_60 = (uint)FSb[local_44 >> 0x18] << 0x18 ^ (uint)FSb[local_48 >> 0x10 & 0xff] << 0x10 ^
             (uint)FSb[local_4c >> 8 & 0xff] << 8 ^ (uint)FSb[local_50 & 0xff] ^ puVar3[-3];
  local_5c = (uint)FSb[local_50 >> 0x18] << 0x18 ^ (uint)FSb[local_44 >> 0x10 & 0xff] << 0x10 ^
             (uint)FSb[local_48 >> 8 & 0xff] << 8 ^
             (uint)FSb[local_4c & 0xff] ^ (uint)*(size_t *)(puVar3 + -2);
  local_58 = (uint)FSb[local_4c >> 0x18] << 0x18 ^ (uint)FSb[local_50 >> 0x10 & 0xff] << 0x10 ^
             (uint)FSb[local_44 >> 8 & 0xff] << 8 ^ (uint)FSb[local_48 & 0xff] ^ puVar3[-1];
  local_54 = (uint)FSb[local_48 >> 0x18] << 0x18 ^ (uint)FSb[local_4c >> 0x10 & 0xff] << 0x10 ^
             (uint)FSb[local_50 >> 8 & 0xff] << 8 ^ (uint)FSb[local_44 & 0xff] ^ *puVar3;
  *(uint *)output = local_60;
  *(uint *)(output + 4) = local_5c;
  *(uint *)(output + 8) = local_58;
  *(uint *)(output + 0xc) = local_54;
  local_40 = output;
  mbedtls_platform_zeroize(&local_60,0x20);
  return 0;
}

Assistant:

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,
                                 const unsigned char input[16],
                                 unsigned char output[16])
{
    int i;
    uint32_t *RK = ctx->buf + ctx->rk_offset;
    struct {
        uint32_t X[4];
        uint32_t Y[4];
    } t;

    t.X[0] = MBEDTLS_GET_UINT32_LE(input,  0); t.X[0] ^= *RK++;
    t.X[1] = MBEDTLS_GET_UINT32_LE(input,  4); t.X[1] ^= *RK++;
    t.X[2] = MBEDTLS_GET_UINT32_LE(input,  8); t.X[2] ^= *RK++;
    t.X[3] = MBEDTLS_GET_UINT32_LE(input, 12); t.X[3] ^= *RK++;

    for (i = (ctx->nr >> 1) - 1; i > 0; i--) {
        AES_FROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);
        AES_FROUND(t.X[0], t.X[1], t.X[2], t.X[3], t.Y[0], t.Y[1], t.Y[2], t.Y[3]);
    }

    AES_FROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);

    t.X[0] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[0])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[1])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[2])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[3])] << 24);

    t.X[1] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[1])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[2])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[3])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[0])] << 24);

    t.X[2] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[2])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[3])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[0])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[1])] << 24);

    t.X[3] = *RK++ ^ \
             ((uint32_t) FSb[MBEDTLS_BYTE_0(t.Y[3])]) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_1(t.Y[0])] <<  8) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_2(t.Y[1])] << 16) ^
             ((uint32_t) FSb[MBEDTLS_BYTE_3(t.Y[2])] << 24);

    MBEDTLS_PUT_UINT32_LE(t.X[0], output,  0);
    MBEDTLS_PUT_UINT32_LE(t.X[1], output,  4);
    MBEDTLS_PUT_UINT32_LE(t.X[2], output,  8);
    MBEDTLS_PUT_UINT32_LE(t.X[3], output, 12);

    mbedtls_platform_zeroize(&t, sizeof(t));

    return 0;
}